

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_UndeclaredFunctionCallInAssignmentThrows_Test::
~SemanticAnalyserTest_UndeclaredFunctionCallInAssignmentThrows_Test
          (SemanticAnalyserTest_UndeclaredFunctionCallInAssignmentThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_UndeclaredFunctionCallInAssignmentThrows_Test
            ((SemanticAnalyserTest_UndeclaredFunctionCallInAssignmentThrows_Test *)0x1e8f98);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredFunctionCallInAssignmentThrows)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = 42;
    x = test(12);
    ret 0;
  }
  )SRC";
  throwTest(source);
}